

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O0

int llvm::APInt::tcMultiplyPart
              (WordType *dst,WordType *src,WordType multiplier,WordType carry,uint srcParts,
              uint dstParts,bool add)

{
  uint uVar1;
  uint *puVar2;
  WordType WVar3;
  WordType WVar4;
  ulong uVar5;
  WordType WVar6;
  WordType WVar7;
  WordType WVar8;
  long lVar9;
  WordType WVar10;
  uint local_6c;
  uint i_1;
  WordType srcPart;
  WordType high;
  WordType mid;
  WordType low;
  uint i;
  uint n;
  uint uStack_34;
  bool add_local;
  uint dstParts_local;
  uint srcParts_local;
  WordType carry_local;
  WordType multiplier_local;
  WordType *src_local;
  WordType *dst_local;
  
  n = dstParts;
  uStack_34 = srcParts;
  _dstParts_local = carry;
  carry_local = multiplier;
  multiplier_local = (WordType)src;
  src_local = dst;
  if (src < dst && dst < src + srcParts) {
    __assert_fail("dst <= src || dst >= src + srcParts",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                  ,0x957,
                  "static int llvm::APInt::tcMultiplyPart(WordType *, const WordType *, WordType, WordType, unsigned int, unsigned int, bool)"
                 );
  }
  if (dstParts <= srcParts + 1) {
    puVar2 = std::min<unsigned_int>(&n,&stack0xffffffffffffffcc);
    uVar1 = *puVar2;
    for (low._4_4_ = 0; low._4_4_ < uVar1; low._4_4_ = low._4_4_ + 1) {
      WVar10 = *(WordType *)(multiplier_local + (ulong)low._4_4_ * 8);
      if ((carry_local == 0) || (WVar10 == 0)) {
        mid = _dstParts_local;
        srcPart = 0;
      }
      else {
        WVar3 = lowHalf(WVar10);
        WVar4 = lowHalf(carry_local);
        uVar5 = WVar3 * WVar4;
        WVar3 = highHalf(WVar10);
        WVar4 = highHalf(carry_local);
        WVar6 = lowHalf(WVar10);
        WVar7 = highHalf(carry_local);
        WVar8 = highHalf(WVar6 * WVar7);
        srcPart = WVar8 + WVar3 * WVar4;
        lVar9 = WVar6 * WVar7 << 0x20;
        if (uVar5 + lVar9 < uVar5) {
          srcPart = srcPart + 1;
        }
        uVar5 = lVar9 + uVar5;
        WVar10 = highHalf(WVar10);
        WVar3 = lowHalf(carry_local);
        WVar4 = highHalf(WVar10 * WVar3);
        srcPart = WVar4 + srcPart;
        lVar9 = WVar10 * WVar3 << 0x20;
        if (uVar5 + lVar9 < uVar5) {
          srcPart = srcPart + 1;
        }
        uVar5 = lVar9 + uVar5;
        if (uVar5 + _dstParts_local < uVar5) {
          srcPart = srcPart + 1;
        }
        mid = _dstParts_local + uVar5;
      }
      if (add) {
        if (mid + src_local[low._4_4_] < mid) {
          srcPart = srcPart + 1;
        }
        src_local[low._4_4_] = mid + src_local[low._4_4_];
      }
      else {
        src_local[low._4_4_] = mid;
      }
      _dstParts_local = srcPart;
    }
    if (uStack_34 < n) {
      if (uStack_34 + 1 != n) {
        __assert_fail("srcParts + 1 == dstParts",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                      ,0x992,
                      "static int llvm::APInt::tcMultiplyPart(WordType *, const WordType *, WordType, WordType, unsigned int, unsigned int, bool)"
                     );
      }
      src_local[uStack_34] = _dstParts_local;
      dst_local._4_4_ = 0;
    }
    else if (_dstParts_local == 0) {
      if (carry_local != 0) {
        for (local_6c = n; local_6c < uStack_34; local_6c = local_6c + 1) {
          if (*(long *)(multiplier_local + (ulong)local_6c * 8) != 0) {
            return 1;
          }
        }
      }
      dst_local._4_4_ = 0;
    }
    else {
      dst_local._4_4_ = 1;
    }
    return dst_local._4_4_;
  }
  __assert_fail("dstParts <= srcParts + 1",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                ,0x958,
                "static int llvm::APInt::tcMultiplyPart(WordType *, const WordType *, WordType, WordType, unsigned int, unsigned int, bool)"
               );
}

Assistant:

int APInt::tcMultiplyPart(WordType *dst, const WordType *src,
                          WordType multiplier, WordType carry,
                          unsigned srcParts, unsigned dstParts,
                          bool add) {
  /* Otherwise our writes of DST kill our later reads of SRC.  */
  assert(dst <= src || dst >= src + srcParts);
  assert(dstParts <= srcParts + 1);

  /* N loops; minimum of dstParts and srcParts.  */
  unsigned n = std::min(dstParts, srcParts);

  for (unsigned i = 0; i < n; i++) {
    WordType low, mid, high, srcPart;

      /* [ LOW, HIGH ] = MULTIPLIER * SRC[i] + DST[i] + CARRY.

         This cannot overflow, because

         (n - 1) * (n - 1) + 2 (n - 1) = (n - 1) * (n + 1)

         which is less than n^2.  */

    srcPart = src[i];

    if (multiplier == 0 || srcPart == 0) {
      low = carry;
      high = 0;
    } else {
      low = lowHalf(srcPart) * lowHalf(multiplier);
      high = highHalf(srcPart) * highHalf(multiplier);

      mid = lowHalf(srcPart) * highHalf(multiplier);
      high += highHalf(mid);
      mid <<= APINT_BITS_PER_WORD / 2;
      if (low + mid < low)
        high++;
      low += mid;

      mid = highHalf(srcPart) * lowHalf(multiplier);
      high += highHalf(mid);
      mid <<= APINT_BITS_PER_WORD / 2;
      if (low + mid < low)
        high++;
      low += mid;

      /* Now add carry.  */
      if (low + carry < low)
        high++;
      low += carry;
    }

    if (add) {
      /* And now DST[i], and store the new low part there.  */
      if (low + dst[i] < low)
        high++;
      dst[i] += low;
    } else
      dst[i] = low;

    carry = high;
  }

  if (srcParts < dstParts) {
    /* Full multiplication, there is no overflow.  */
    assert(srcParts + 1 == dstParts);
    dst[srcParts] = carry;
    return 0;
  }

  /* We overflowed if there is carry.  */
  if (carry)
    return 1;

  /* We would overflow if any significant unwritten parts would be
     non-zero.  This is true if any remaining src parts are non-zero
     and the multiplier is non-zero.  */
  if (multiplier)
    for (unsigned i = dstParts; i < srcParts; i++)
      if (src[i])
        return 1;

  /* We fitted in the narrow destination.  */
  return 0;
}